

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1.h
# Opt level: O2

void ncnn::conv1x1s1_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  void *pvVar2;
  void *pvVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  uint _c;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  float fVar19;
  Mat out;
  Mat local_b0;
  Mat local_70;
  
  lVar13 = (long)bottom_blob->c;
  pvVar2 = _kernel->data;
  pvVar3 = _bias->data;
  iVar12 = top_blob->h * top_blob->w;
  uVar17 = 0;
  uVar18 = (ulong)(uint)top_blob->c;
  if (top_blob->c < 1) {
    uVar18 = uVar17;
  }
  for (; uVar17 != uVar18; uVar17 = uVar17 + 1) {
    Mat::channel(&local_70,top_blob,(int)uVar17);
    if (pvVar3 == (void *)0x0) {
      fVar19 = 0.0;
    }
    else {
      fVar19 = *(float *)((long)pvVar3 + uVar17 * 4);
    }
    Mat::fill(&local_70,fVar19);
    for (uVar16 = 0; pvVar11 = local_70.data, (long)(uVar16 | 3) < lVar13; uVar16 = uVar16 + 4) {
      _c = (uint)uVar16;
      Mat::channel(&local_b0,bottom_blob,_c);
      pvVar7 = local_b0.data;
      Mat::~Mat(&local_b0);
      Mat::channel(&local_b0,bottom_blob,_c | 1);
      pvVar8 = local_b0.data;
      Mat::~Mat(&local_b0);
      Mat::channel(&local_b0,bottom_blob,_c | 2);
      pvVar9 = local_b0.data;
      Mat::~Mat(&local_b0);
      Mat::channel(&local_b0,bottom_blob,_c | 3);
      pvVar10 = local_b0.data;
      Mat::~Mat(&local_b0);
      pfVar1 = (float *)((long)pvVar2 + uVar16 * 4 + uVar17 * lVar13 * 4);
      fVar19 = *pfVar1;
      fVar4 = pfVar1[1];
      fVar5 = pfVar1[2];
      fVar6 = pfVar1[3];
      lVar14 = 0;
      for (iVar15 = iVar12; 0 < iVar15; iVar15 = iVar15 + -1) {
        *(float *)((long)pvVar11 + lVar14) =
             *(float *)((long)pvVar10 + lVar14) * fVar6 + *(float *)((long)pvVar8 + lVar14) * fVar4
             + *(float *)((long)pvVar9 + lVar14) * fVar5 +
               *(float *)((long)pvVar7 + lVar14) * fVar19 + *(float *)((long)pvVar11 + lVar14);
        lVar14 = lVar14 + 4;
      }
    }
    for (; pvVar11 = local_70.data, (long)uVar16 < lVar13; uVar16 = uVar16 + 1) {
      Mat::channel(&local_b0,bottom_blob,(int)uVar16);
      pvVar7 = local_b0.data;
      Mat::~Mat(&local_b0);
      fVar19 = *(float *)((long)pvVar2 + uVar16 * 4 + uVar17 * lVar13 * 4);
      lVar14 = 0;
      for (iVar15 = iVar12; 0 < iVar15; iVar15 = iVar15 + -1) {
        *(float *)((long)pvVar11 + lVar14) =
             *(float *)((long)pvVar7 + lVar14) * fVar19 + *(float *)((long)pvVar11 + lVar14);
        lVar14 = lVar14 + 4;
      }
    }
    Mat::~Mat(&local_70);
  }
  return;
}

Assistant:

static void conv1x1s1_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<outch; p++)
    {
        Mat out = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        out.fill(bias0);

        int q = 0;

        for (; q+3<inch; q+=4)
        {
            float* outptr = out;

            const float* img0 = bottom_blob.channel(q);
            const float* img1 = bottom_blob.channel(q+1);
            const float* img2 = bottom_blob.channel(q+2);
            const float* img3 = bottom_blob.channel(q+3);

            const float* kernel0 = kernel + p*inch  + q;
            const float k0 = kernel0[0];
            const float k1 = kernel0[1];
            const float k2 = kernel0[2];
            const float k3 = kernel0[3];

            const float* r0 = img0;
            const float* r1 = img1;
            const float* r2 = img2;
            const float* r3 = img3;

            int size = outw * outh;

            int remain = size;

            for (; remain>0; remain--)
            {
                float sum = *r0 * k0;
                float sum1 = *r1 * k1;
                float sum2 = *r2 * k2;
                float sum3 = *r3 * k3;

                *outptr += sum + sum1 + sum2 + sum3;

                r0++;
                r1++;
                r2++;
                r3++;
                outptr++;
            }

        }

        for (; q<inch; q++)
        {
            float* outptr = out;

            const float* img0 = bottom_blob.channel(q);

            const float* kernel0 = kernel + p*inch  + q;
            const float k0 = kernel0[0];

            const float* r0 = img0;

            int size = outw * outh;

            int remain = size;

            for (; remain>0; remain--)
            {
                float sum = *r0 * k0;

                *outptr += sum;

                r0++;
                outptr++;
            }

        }
    }

}